

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtCompoundCompoundLeafCallback::Process
          (cbtCompoundCompoundLeafCallback *this,cbtDbvtNode *leaf0,cbtDbvtNode *leaf1)

{
  float fVar1;
  uint indexA;
  uint indexB;
  cbtTransform *pcVar2;
  cbtCollisionShape *pcVar3;
  void *pvVar4;
  cbtCollisionShape *pcVar5;
  cbtCollisionShape *pcVar6;
  cbtManifoldResult *pcVar7;
  cbtCollisionObjectWrapper *pcVar8;
  cbtCollisionObjectWrapper *pcVar9;
  bool bVar10;
  int iVar11;
  cbtSimplePair *pcVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  CProfileSample __profile;
  cbtVector3 local_1d8;
  cbtVector3 local_1c8;
  cbtCollisionObjectWrapper compoundWrap1;
  cbtCollisionObjectWrapper compoundWrap0;
  cbtVector3 aabbMax1;
  cbtVector3 aabbMin1;
  cbtTransform newChildWorldTrans1;
  cbtTransform newChildWorldTrans0;
  cbtTransform orgTrans1;
  cbtTransform orgTrans0;
  long *plVar13;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)&__profile,"cbtCompoundCompoundLeafCallback::Process");
  this->m_numOverlapPairs = this->m_numOverlapPairs + 1;
  indexA = (leaf0->field_2).dataAsInt;
  indexB = (leaf1->field_2).dataAsInt;
  pcVar2 = this->m_compound0ColObjWrap->m_worldTransform;
  pcVar3 = this->m_compound1ColObjWrap->m_shape;
  pvVar4 = this->m_compound0ColObjWrap->m_shape[1].m_userPointer;
  orgTrans0.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pcVar2->m_basis).m_el[0].m_floats;
  orgTrans0.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((pcVar2->m_basis).m_el[0].m_floats + 2)
  ;
  pcVar5 = *(cbtCollisionShape **)((long)pvVar4 + (long)(int)indexA * 0x58 + 0x40);
  pcVar6 = *(cbtCollisionShape **)((long)pcVar3[1].m_userPointer + (long)(int)indexB * 0x58 + 0x40);
  orgTrans0.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pcVar2->m_basis).m_el[1].m_floats;
  orgTrans0.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((pcVar2->m_basis).m_el[1].m_floats + 2)
  ;
  orgTrans0.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pcVar2->m_basis).m_el[2].m_floats;
  orgTrans0.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((pcVar2->m_basis).m_el[2].m_floats + 2)
  ;
  orgTrans0.m_origin.m_floats._0_8_ = *(undefined8 *)(pcVar2->m_origin).m_floats;
  orgTrans0.m_origin.m_floats._8_8_ = *(undefined8 *)((pcVar2->m_origin).m_floats + 2);
  cbtTransform::operator*
            (&newChildWorldTrans0,&orgTrans0,
             (cbtTransform *)((long)pvVar4 + (long)(int)indexA * 0x58));
  pcVar2 = this->m_compound1ColObjWrap->m_worldTransform;
  orgTrans1.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pcVar2->m_basis).m_el[0].m_floats;
  orgTrans1.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((pcVar2->m_basis).m_el[0].m_floats + 2)
  ;
  orgTrans1.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pcVar2->m_basis).m_el[1].m_floats;
  orgTrans1.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((pcVar2->m_basis).m_el[1].m_floats + 2)
  ;
  orgTrans1.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pcVar2->m_basis).m_el[2].m_floats;
  orgTrans1.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((pcVar2->m_basis).m_el[2].m_floats + 2)
  ;
  orgTrans1.m_origin.m_floats._0_8_ = *(undefined8 *)(pcVar2->m_origin).m_floats;
  orgTrans1.m_origin.m_floats._8_8_ = *(undefined8 *)((pcVar2->m_origin).m_floats + 2);
  cbtTransform::operator*
            (&newChildWorldTrans1,&orgTrans1,
             (cbtTransform *)((long)(int)indexB * 0x58 + (long)pcVar3[1].m_userPointer));
  (*pcVar5->_vptr_cbtCollisionShape[2])(pcVar5,&newChildWorldTrans0,&local_1c8,&local_1d8);
  (*pcVar6->_vptr_cbtCollisionShape[2])(pcVar6,&newChildWorldTrans1,&aabbMin1,&aabbMax1);
  auVar14._8_8_ = 0;
  auVar14._0_4_ = local_1c8.m_floats[0];
  auVar14._4_4_ = local_1c8.m_floats[1];
  fVar1 = this->m_resultOut->m_closestPointDistanceThreshold;
  auVar16._4_4_ = fVar1;
  auVar16._0_4_ = fVar1;
  auVar16._8_4_ = fVar1;
  auVar16._12_4_ = fVar1;
  auVar14 = vsubps_avx(auVar14,auVar16);
  local_1c8.m_floats._0_8_ = vmovlps_avx(auVar14);
  local_1c8.m_floats[2] = local_1c8.m_floats[2] - fVar1;
  auVar15._0_4_ = fVar1 + local_1d8.m_floats[0];
  auVar15._4_4_ = fVar1 + local_1d8.m_floats[1];
  auVar15._8_4_ = fVar1 + 0.0;
  auVar15._12_4_ = fVar1 + 0.0;
  local_1d8.m_floats._0_8_ = vmovlps_avx(auVar15);
  local_1d8.m_floats[2] = fVar1 + local_1d8.m_floats[2];
  if (gCompoundCompoundChildShapePairCallback != (cbtShapePairCallback)0x0) {
    bVar10 = (*gCompoundCompoundChildShapePairCallback)(pcVar5,pcVar6);
    if (!bVar10) goto LAB_00dec6b2;
  }
  bVar10 = TestAabbAgainstAabb2(&local_1c8,&local_1d8,&aabbMin1,&aabbMax1);
  if (bVar10) {
    compoundWrap0.m_parent = this->m_compound0ColObjWrap;
    compoundWrap0.m_collisionObject = (compoundWrap0.m_parent)->m_collisionObject;
    compoundWrap0.m_partId = -1;
    compoundWrap1.m_parent = this->m_compound1ColObjWrap;
    compoundWrap1.m_collisionObject = (compoundWrap1.m_parent)->m_collisionObject;
    compoundWrap1.m_partId = -1;
    compoundWrap1.m_shape = pcVar6;
    compoundWrap1.m_worldTransform = &newChildWorldTrans1;
    compoundWrap1.m_index = indexB;
    compoundWrap0.m_shape = pcVar5;
    compoundWrap0.m_worldTransform = &newChildWorldTrans0;
    compoundWrap0.m_index = indexA;
    pcVar12 = cbtHashedSimplePairCache::findPair(this->m_childCollisionAlgorithmCache,indexA,indexB)
    ;
    fVar1 = this->m_resultOut->m_closestPointDistanceThreshold;
    if (fVar1 <= 0.0) {
      if (pcVar12 == (cbtSimplePair *)0x0) {
        iVar11 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                           (this->m_dispatcher,&compoundWrap0,&compoundWrap1,this->m_sharedManifold,
                            1);
        plVar13 = (long *)CONCAT44(extraout_var_00,iVar11);
        iVar11 = (*this->m_childCollisionAlgorithmCache->_vptr_cbtHashedSimplePairCache[3])
                           (this->m_childCollisionAlgorithmCache,(ulong)indexA,(ulong)indexB);
        *(long **)(CONCAT44(extraout_var_01,iVar11) + 8) = plVar13;
      }
      else {
        plVar13 = (long *)(pcVar12->field_2).m_userPointer;
      }
    }
    else {
      iVar11 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                         (this->m_dispatcher,&compoundWrap0,&compoundWrap1,0,2);
      plVar13 = (long *)CONCAT44(extraout_var,iVar11);
    }
    pcVar7 = this->m_resultOut;
    pcVar8 = pcVar7->m_body0Wrap;
    pcVar9 = pcVar7->m_body1Wrap;
    pcVar7->m_body0Wrap = &compoundWrap0;
    pcVar7->m_body1Wrap = &compoundWrap1;
    (*(pcVar7->super_Result)._vptr_Result[2])(pcVar7,0xffffffffffffffff,(ulong)indexA);
    (*(this->m_resultOut->super_Result)._vptr_Result[3])
              (this->m_resultOut,0xffffffffffffffff,(ulong)indexB);
    (**(code **)(*plVar13 + 0x10))
              (plVar13,&compoundWrap0,&compoundWrap1,this->m_dispatchInfo,this->m_resultOut);
    pcVar7 = this->m_resultOut;
    pcVar7->m_body0Wrap = pcVar8;
    pcVar7->m_body1Wrap = pcVar9;
    if (0.0 < fVar1) {
      (**(code **)*plVar13)(plVar13);
      (*this->m_dispatcher->_vptr_cbtDispatcher[0xf])(this->m_dispatcher,plVar13);
    }
  }
LAB_00dec6b2:
  CProfileSample::~CProfileSample((CProfileSample *)&__profile);
  return;
}

Assistant:

void Process(const cbtDbvtNode* leaf0, const cbtDbvtNode* leaf1)
	{
		BT_PROFILE("cbtCompoundCompoundLeafCallback::Process");
		m_numOverlapPairs++;

		int childIndex0 = leaf0->dataAsInt;
		int childIndex1 = leaf1->dataAsInt;

		cbtAssert(childIndex0 >= 0);
		cbtAssert(childIndex1 >= 0);

		const cbtCompoundShape* compoundShape0 = static_cast<const cbtCompoundShape*>(m_compound0ColObjWrap->getCollisionShape());
		cbtAssert(childIndex0 < compoundShape0->getNumChildShapes());

		const cbtCompoundShape* compoundShape1 = static_cast<const cbtCompoundShape*>(m_compound1ColObjWrap->getCollisionShape());
		cbtAssert(childIndex1 < compoundShape1->getNumChildShapes());

		const cbtCollisionShape* childShape0 = compoundShape0->getChildShape(childIndex0);
		const cbtCollisionShape* childShape1 = compoundShape1->getChildShape(childIndex1);

		//backup
		cbtTransform orgTrans0 = m_compound0ColObjWrap->getWorldTransform();
		const cbtTransform& childTrans0 = compoundShape0->getChildTransform(childIndex0);
		cbtTransform newChildWorldTrans0 = orgTrans0 * childTrans0;

		cbtTransform orgTrans1 = m_compound1ColObjWrap->getWorldTransform();
		const cbtTransform& childTrans1 = compoundShape1->getChildTransform(childIndex1);
		cbtTransform newChildWorldTrans1 = orgTrans1 * childTrans1;

		//perform an AABB check first
		cbtVector3 aabbMin0, aabbMax0, aabbMin1, aabbMax1;
		childShape0->getAabb(newChildWorldTrans0, aabbMin0, aabbMax0);
		childShape1->getAabb(newChildWorldTrans1, aabbMin1, aabbMax1);

		cbtVector3 thresholdVec(m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold);

		aabbMin0 -= thresholdVec;
		aabbMax0 += thresholdVec;

		if (gCompoundCompoundChildShapePairCallback)
		{
			if (!gCompoundCompoundChildShapePairCallback(childShape0, childShape1))
				return;
		}

		if (TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
		{
			cbtCollisionObjectWrapper compoundWrap0(this->m_compound0ColObjWrap, childShape0, m_compound0ColObjWrap->getCollisionObject(), newChildWorldTrans0, -1, childIndex0);
			cbtCollisionObjectWrapper compoundWrap1(this->m_compound1ColObjWrap, childShape1, m_compound1ColObjWrap->getCollisionObject(), newChildWorldTrans1, -1, childIndex1);

			cbtSimplePair* pair = m_childCollisionAlgorithmCache->findPair(childIndex0, childIndex1);
			bool removePair = false;
			cbtCollisionAlgorithm* colAlgo = 0;
			if (m_resultOut->m_closestPointDistanceThreshold > 0)
			{
				colAlgo = m_dispatcher->findAlgorithm(&compoundWrap0, &compoundWrap1, 0, BT_CLOSEST_POINT_ALGORITHMS);
				removePair = true;
			}
			else
			{
				if (pair)
				{
					colAlgo = (cbtCollisionAlgorithm*)pair->m_userPointer;
				}
				else
				{
					colAlgo = m_dispatcher->findAlgorithm(&compoundWrap0, &compoundWrap1, m_sharedManifold, BT_CONTACT_POINT_ALGORITHMS);
					pair = m_childCollisionAlgorithmCache->addOverlappingPair(childIndex0, childIndex1);
					cbtAssert(pair);
					pair->m_userPointer = colAlgo;
				}
			}

			cbtAssert(colAlgo);

			const cbtCollisionObjectWrapper* tmpWrap0 = 0;
			const cbtCollisionObjectWrapper* tmpWrap1 = 0;

			tmpWrap0 = m_resultOut->getBody0Wrap();
			tmpWrap1 = m_resultOut->getBody1Wrap();

			m_resultOut->setBody0Wrap(&compoundWrap0);
			m_resultOut->setBody1Wrap(&compoundWrap1);

			m_resultOut->setShapeIdentifiersA(-1, childIndex0);
			m_resultOut->setShapeIdentifiersB(-1, childIndex1);

			colAlgo->processCollision(&compoundWrap0, &compoundWrap1, m_dispatchInfo, m_resultOut);

			m_resultOut->setBody0Wrap(tmpWrap0);
			m_resultOut->setBody1Wrap(tmpWrap1);

			if (removePair)
			{
				colAlgo->~cbtCollisionAlgorithm();
				m_dispatcher->freeCollisionAlgorithm(colAlgo);
			}
		}
	}